

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

Phdr * __thiscall pstack::Elf::Object::getSegmentForAddress(Object *this,Off a)

{
  pointer paVar1;
  ProgramHeaders *pPVar2;
  ulong uVar3;
  pointer paVar4;
  difference_type __d;
  ulong uVar5;
  
  paVar4 = (pointer)this->lastSegmentForAddress;
  if (((paVar4 == (pointer)0x0) || (a < paVar4->p_vaddr)) ||
     (paVar4->p_vaddr + paVar4->p_memsz <= a)) {
    pPVar2 = getSegments(this,1);
    paVar4 = (pPVar2->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl.
             super__Vector_impl_data._M_start;
    paVar1 = (pPVar2->super__Vector_base<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar5 = ((long)paVar1 - (long)paVar4) / 0x38;
    while (uVar3 = uVar5, 0 < (long)uVar3) {
      uVar5 = uVar3 >> 1;
      if (paVar4[uVar5].p_memsz + paVar4[uVar5].p_vaddr <= a) {
        paVar4 = paVar4 + uVar5 + 1;
        uVar5 = ~uVar5 + uVar3;
      }
    }
    if ((paVar4 == paVar1) || (a < paVar4->p_vaddr)) {
      paVar4 = (pointer)0x0;
    }
    else {
      this->lastSegmentForAddress = (Phdr *)paVar4;
    }
  }
  return (Phdr *)paVar4;
}

Assistant:

const Phdr *
Object::getSegmentForAddress(Off a) const
{
    if (lastSegmentForAddress != nullptr &&
          lastSegmentForAddress->p_vaddr <= a &&
          lastSegmentForAddress->p_vaddr + lastSegmentForAddress->p_memsz > a)
       return lastSegmentForAddress;
    const auto &hdrs = getSegments(PT_LOAD);

    auto pos = std::lower_bound(hdrs.begin(), hdrs.end(), a,
            [] (const Elf::Phdr &header, Elf::Off addr) {
            return header.p_vaddr + header.p_memsz <= addr; });
    if (pos != hdrs.end() && pos->p_vaddr <= a) {
        lastSegmentForAddress = &*pos;
        return lastSegmentForAddress;
    }
    return nullptr;
}